

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasWeakFields(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  int iVar2;
  Descriptor *in_RDI;
  int i;
  Options *in_stack_00000030;
  FieldDescriptor *in_stack_00000038;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(in_RDI);
    if (iVar2 <= local_1c) {
      return false;
    }
    Descriptor::field(in_RDI,local_1c);
    bVar1 = IsWeak(in_stack_00000038,in_stack_00000030);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool HasWeakFields(const Descriptor* descriptor, const Options& options) {
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (IsWeak(descriptor->field(i), options)) return true;
  }
  return false;
}